

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3aed2::doFrameBuffer
               (vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *storage,Header *hdr,
               FrameBuffer *dummy)

{
  bool bVar1;
  int iVar2;
  Slice *pSVar3;
  reference pvVar4;
  char *in_RDX;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_RDI;
  ConstIterator q_1;
  int chan;
  int offset;
  int ystride;
  int xstride;
  Box2i dw;
  ConstIterator q;
  int chans;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  size_type in_stack_ffffffffffffff18;
  char *pcVar5;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_ffffffffffffff20;
  Slice local_b8 [56];
  undefined8 local_80;
  undefined8 local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_60;
  int local_5c;
  int local_48;
  int local_44;
  const_iterator local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  char *local_18;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *local_8;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  Imf_3_4::Header::channels();
  local_28 = Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    local_30 = Imf_3_4::ChannelList::end();
    bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    local_1c = local_1c + 1;
    local_38._M_node =
         (_Base_ptr)
         Imf_3_4::ChannelList::ConstIterator::operator++
                   ((ConstIterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0
                   );
  }
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar2 = local_1c * 2;
  local_5c = iVar2;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_60 = iVar2 * (local_68 + 1);
  local_6c = local_60 * local_44 + local_48 * local_5c;
  local_70 = 0;
  Imf_3_4::Header::channels();
  local_78 = Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    local_80 = Imf_3_4::ChannelList::end();
    bVar1 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    pcVar5 = local_18;
    pSVar3 = (Slice *)Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x1432bf);
    pvVar4 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                       (local_8,(long)local_70);
    in_stack_fffffffffffffef8 = 1;
    in_stack_ffffffffffffff00 = 0;
    Imf_3_4::Slice::Slice
              (local_b8,HALF,(char *)((long)pvVar4 - (long)local_6c),(long)local_5c,(long)local_60,1
               ,1,0.0,false,false);
    Imf_3_4::FrameBuffer::insert(pcVar5,pSVar3);
    local_70 = local_70 + 1;
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
  }
  return;
}

Assistant:

void
doFrameBuffer (vector<half>& storage, const Header& hdr, FrameBuffer& dummy)
{

    int chans = 0;
    for (ChannelList::ConstIterator q = hdr.channels ().begin ();
         q != hdr.channels ().end ();
         q++)
    {
        chans++;
    }

    Box2i dw = hdr.dataWindow ();

    storage.resize ((dw.size ().x + 1) * (dw.size ().y + 1) * chans);

    int xstride = chans * sizeof (half);
    int ystride = xstride * (dw.size ().x + 1);
    int offset  = ystride * dw.min.y + dw.min.x * xstride;

    int chan = 0;
    for (ChannelList::ConstIterator q = hdr.channels ().begin ();
         q != hdr.channels ().end ();
         q++)
    {
        dummy.insert (
            q.name (),
            Slice (HALF, ((char*) &storage[chan]) - offset, xstride, ystride));
        chan++;
    }
}